

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederate.cpp
# Opt level: O3

void __thiscall helics::MessageFederate::MessageFederate(MessageFederate *this,bool param_1)

{
  Federate::Federate((Federate *)&this->field_0x10);
  this->_vptr_MessageFederate = (_func_int **)0x53eea8;
  *(undefined8 *)&this->field_0x10 = 0x53ef70;
  (this->mfManager)._M_t.
  super___uniq_ptr_impl<helics::MessageFederateManager,_std::default_delete<helics::MessageFederateManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::MessageFederateManager_*,_std::default_delete<helics::MessageFederateManager>_>
  .super__Head_base<0UL,_helics::MessageFederateManager_*,_false>._M_head_impl =
       (MessageFederateManager *)0x0;
  loadFederateData(this);
  return;
}

Assistant:

MessageFederate::MessageFederate(bool /*unused*/)
{  // this constructor should only be called by child class that has already constructed the
   // underlying federate in
    // a virtual inheritance
    loadFederateData();
}